

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::addCopyTests
               (TestCaseGroup *root,deUint32 srcFormat,deUint32 dstFormat)

{
  deUint32 target;
  bool bVar1;
  CompressedTexFormat CVar2;
  TestCaseGroup *pTVar3;
  Context *pCVar4;
  char *pcVar5;
  char *pcVar6;
  CopyImageTest *this;
  deUint32 format;
  bool local_1ea;
  bool local_1c2;
  ImageInfo local_190;
  ImageInfo local_17c;
  undefined1 local_168 [8];
  IVec3 dstSize;
  IVec3 srcSize;
  IVec3 targetSize;
  bool isCompressedCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string targetTestName;
  int iStack_d8;
  bool dstIs3D;
  deUint32 dstTarget;
  int dstTargetNdx;
  int iStack_cc;
  bool srcIs3D;
  deUint32 srcTarget;
  int srcTargetNdx;
  deUint32 targets [5];
  TestCaseGroup *group;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string groupName;
  deUint32 dstFormat_local;
  deUint32 srcFormat_local;
  TestCaseGroup *root_local;
  
  groupName.field_2._8_4_ = dstFormat;
  groupName.field_2._12_4_ = srcFormat;
  (anonymous_namespace)::formatToName_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)(ulong)srcFormat,dstFormat);
  std::operator+(&local_58,&local_78,"_");
  (anonymous_namespace)::formatToName_abi_cxx11_
            ((string *)&group,(_anonymous_namespace_ *)(ulong)(uint)groupName.field_2._8_4_,format);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&group);
  std::__cxx11::string::~string((string *)&group);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  pCVar4 = TestCaseGroup::getContext(root);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  TestCaseGroup::TestCaseGroup(pTVar3,pCVar4,pcVar5,pcVar6);
  _srcTarget = 0x806f00000de1;
  targets[0] = 0x8513;
  targets[1] = 0x8c1a;
  targets[2] = 0x8d41;
  unique0x10000684 = pTVar3;
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar3);
  iStack_cc = 0;
  do {
    if (4 < iStack_cc) {
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    target = (&srcTarget)[iStack_cc];
    bVar1 = glu::isCompressedFormat(groupName.field_2._12_4_);
    if (((!bVar1) || (target != 0x8d41)) &&
       ((target != 0x8d41 || (bVar1 = isColorRenderable(groupName.field_2._12_4_), bVar1)))) {
      bVar1 = glu::isCompressedFormat(groupName.field_2._12_4_);
      if (bVar1) {
        CVar2 = glu::mapGLCompressedTexFormat(groupName.field_2._12_4_);
        bVar1 = tcu::isAstcFormat(CVar2);
        if ((!bVar1) && (target == 0x8c1a || target == 0x806f)) goto LAB_009f1ac1;
      }
      for (iStack_d8 = 0; iStack_d8 < 5; iStack_d8 = iStack_d8 + 1) {
        targetTestName.field_2._12_4_ = (&srcTarget)[iStack_d8];
        local_1c2 = targetTestName.field_2._12_4_ == 0x8c1a ||
                    targetTestName.field_2._12_4_ == 0x806f;
        targetTestName.field_2._M_local_buf[0xb] = local_1c2;
        bVar1 = glu::isCompressedFormat(groupName.field_2._8_4_);
        if (((!bVar1) || (targetTestName.field_2._12_4_ != 0x8d41)) &&
           ((targetTestName.field_2._12_4_ != 0x8d41 ||
            (bVar1 = isColorRenderable(groupName.field_2._8_4_), bVar1)))) {
          bVar1 = glu::isCompressedFormat(groupName.field_2._8_4_);
          if (bVar1) {
            CVar2 = glu::mapGLCompressedTexFormat(groupName.field_2._8_4_);
            bVar1 = tcu::isAstcFormat(CVar2);
            if ((!bVar1) && ((targetTestName.field_2._M_local_buf[0xb] & 1U) != 0))
            goto LAB_009f1a24;
          }
          pcVar5 = targetToName(target);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(targetSize.m_data + 2),pcVar5,
                     (allocator<char> *)((long)targetSize.m_data + 7));
          std::operator+(&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (targetSize.m_data + 2),"_to_");
          pcVar5 = targetToName(targetTestName.field_2._12_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_120,pcVar5);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)(targetSize.m_data + 2));
          std::allocator<char>::~allocator((allocator<char> *)((long)targetSize.m_data + 7));
          bVar1 = glu::isCompressedFormat(groupName.field_2._12_4_);
          local_1ea = true;
          if (!bVar1) {
            local_1ea = glu::isCompressedFormat(groupName.field_2._8_4_);
          }
          targetSize.m_data[1]._2_1_ = local_1ea;
          if (local_1ea == false) {
            tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcSize.m_data + 1),0x40,0x40,8);
          }
          else {
            tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(srcSize.m_data + 1),0x80,0x80,0x10);
          }
          getTestedSize((anon_unknown_0 *)(dstSize.m_data + 1),target,groupName.field_2._12_4_,
                        (IVec3 *)(srcSize.m_data + 1));
          getTestedSize((anon_unknown_0 *)local_168,targetTestName.field_2._12_4_,
                        groupName.field_2._8_4_,(IVec3 *)(srcSize.m_data + 1));
          pTVar3 = stack0xffffffffffffff50;
          this = (CopyImageTest *)operator_new(0xb0);
          pCVar4 = TestCaseGroup::getContext(root);
          ImageInfo::ImageInfo
                    (&local_17c,groupName.field_2._12_4_,target,(IVec3 *)(dstSize.m_data + 1));
          ImageInfo::ImageInfo
                    (&local_190,groupName.field_2._8_4_,targetTestName.field_2._12_4_,
                     (IVec3 *)local_168);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          CopyImageTest::CopyImageTest(this,pCVar4,&local_17c,&local_190,pcVar5,pcVar6);
          tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this);
          std::__cxx11::string::~string((string *)local_100);
        }
LAB_009f1a24:
      }
    }
LAB_009f1ac1:
    iStack_cc = iStack_cc + 1;
  } while( true );
}

Assistant:

void addCopyTests (TestCaseGroup* root, deUint32 srcFormat, deUint32 dstFormat)
{
	const string			groupName	= string(formatToName(srcFormat)) + "_" + formatToName(dstFormat);
	TestCaseGroup* const	group		= new TestCaseGroup(root->getContext(), groupName.c_str(), groupName.c_str());

	const deUint32 targets[] =
	{
		GL_TEXTURE_2D,
		GL_TEXTURE_3D,
		GL_TEXTURE_CUBE_MAP,
		GL_TEXTURE_2D_ARRAY,
		GL_RENDERBUFFER
	};

	root->addChild(group);

	for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(targets); srcTargetNdx++)
	{
		const deUint32	srcTarget				= targets[srcTargetNdx];
		const bool		srcIs3D					= srcTarget == GL_TEXTURE_2D_ARRAY || srcTarget == GL_TEXTURE_3D;

		if (glu::isCompressedFormat(srcFormat) && srcTarget == GL_RENDERBUFFER)
			continue;

		if (srcTarget == GL_RENDERBUFFER && !isColorRenderable(srcFormat))
			continue;

		if (glu::isCompressedFormat(srcFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(srcFormat)) && srcIs3D)
			continue;

		for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(targets); dstTargetNdx++)
		{
			const deUint32	dstTarget				= targets[dstTargetNdx];
			const bool		dstIs3D					= dstTarget == GL_TEXTURE_2D_ARRAY || dstTarget == GL_TEXTURE_3D;

			if (glu::isCompressedFormat(dstFormat) && dstTarget == GL_RENDERBUFFER)
				continue;

			if (dstTarget == GL_RENDERBUFFER && !isColorRenderable(dstFormat))
				continue;

			if (glu::isCompressedFormat(dstFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(dstFormat)) && dstIs3D)
				continue;

			const string	targetTestName	= string(targetToName(srcTarget)) + "_to_" + targetToName(dstTarget);

			// Compressed formats require more space to fit all block size combinations.
			const bool		isCompressedCase	= glu::isCompressedFormat(srcFormat) || glu::isCompressedFormat(dstFormat);
			const IVec3		targetSize			= isCompressedCase ? IVec3(128, 128, 16) : IVec3(64, 64, 8);
			const IVec3		srcSize				= getTestedSize(srcTarget, srcFormat, targetSize);
			const IVec3		dstSize				= getTestedSize(dstTarget, dstFormat, targetSize);

			group->addChild(new CopyImageTest(root->getContext(),
											ImageInfo(srcFormat, srcTarget, srcSize),
											ImageInfo(dstFormat, dstTarget, dstSize),
											targetTestName.c_str(), targetTestName.c_str()));
		}
	}
}